

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O2

int __thiscall E64::blitter_ic::terminal_putchar(blitter_ic *this,uint8_t number,int character)

{
  uint uVar1;
  uint uVar2;
  blit_t *pbVar3;
  blit_t *pbVar4;
  uint16_t uVar5;
  ushort uVar6;
  
  if ((char)character == '\r') {
    pbVar3 = this->blit;
    pbVar4 = pbVar3 + number;
    uVar2._0_2_ = pbVar4->cursor_position;
    uVar2._2_1_ = pbVar4->cursor_interval;
    uVar2._3_1_ = pbVar4->cursor_countdown;
    pbVar3[number].cursor_position =
         (undefined2)uVar2 - (short)((uVar2 & 0xffff) % (uint)pbVar3[number].columns);
  }
  else if ((character & 0xffU) == 10) {
    pbVar3 = this->blit;
    pbVar4 = pbVar3 + number;
    uVar1._0_2_ = pbVar4->cursor_position;
    uVar1._2_1_ = pbVar4->cursor_interval;
    uVar1._3_1_ = pbVar4->cursor_countdown;
    uVar6 = (ushort)pbVar3[number].columns;
    uVar5 = (undefined2)uVar1 - (short)((uVar1 & 0xffff) % (uint)uVar6);
    pbVar3[number].cursor_position = uVar5;
    if ((byte)pbVar3[number].rows - 1 == (uVar1 & 0xffff) / (uint)uVar6) {
      terminal_add_bottom_row(this,number);
    }
    else {
      pbVar3[number].cursor_position = uVar6 + uVar5;
    }
  }
  else if ((character & 0xffU) == 9) {
    while ((this->blit[number].cursor_position % (ushort)this->blit[number].columns & 3) != 0) {
      terminal_putsymbol(this,number,' ');
    }
  }
  else {
    terminal_putsymbol(this,number,(char)character);
  }
  return character & 0xff;
}

Assistant:

int E64::blitter_ic::terminal_putchar(uint8_t number, int character)
{
	uint8_t result = (uint8_t)character;
	switch (result) {
		case '\r':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			break;
		case '\n':
			blit[number].cursor_position -= blit[number].cursor_position % blit[number].get_columns();
			if ((blit[number].cursor_position / blit[number].get_columns()) == (blit[number].get_rows() - 1)) {
				terminal_add_bottom_row(number);
			} else {
				blit[number].cursor_position += blit[number].get_columns();
			}
			break;
		case '\t':
			while ((blit[number].cursor_position % blit[number].get_columns()) & 0b11) {
				terminal_putsymbol(number, ' ');
			}
			break;
		default:
			terminal_putsymbol(number, result);
			break;
	}
	return result;
}